

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cpp
# Opt level: O0

writer * argo::operator<<(writer *w,int i)

{
  string local_1c0 [48];
  ostringstream local_190 [8];
  ostringstream ss;
  int i_local;
  writer *w_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::ostream::operator<<(local_190,i);
  std::__cxx11::ostringstream::str();
  (*w->_vptr_writer[2])(w,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return w;
}

Assistant:

writer &NAMESPACE::operator<<(writer& w, int i)
{
    ostringstream ss;
    ss << i;
    w.write(ss.str());
    return w;
}